

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O2

int __thiscall Rainbow::flFTP::JoinServer(flFTP *this,string *host,string *service)

{
  CommPort *pCVar1;
  __uniq_ptr_data<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>,_true,_true>
  _Var2;
  int iVar3;
  allocator<char> local_289;
  string local_288;
  string local_268 [32];
  string local_248 [32];
  char message [512];
  
  std::__cxx11::string::_M_assign((string *)&this->_host);
  pCVar1 = (this->_commPort)._M_t.
           super___uniq_ptr_impl<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>._M_t.
           super__Tuple_impl<0UL,_Rainbow::CommPort_*,_std::default_delete<Rainbow::CommPort>_>.
           super__Head_base<0UL,_Rainbow::CommPort_*,_false>._M_head_impl;
  std::__cxx11::string::string(local_248,(string *)host);
  std::__cxx11::string::string(local_268,(string *)service);
  _Var2.super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>.
  _M_t.
  super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>.
  super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl =
       (pCVar1->_tcpSock)._M_t.
       super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>;
  iVar3 = (*(code *)**(undefined8 **)
                      _Var2.
                      super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>
                      .super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl)
                    (_Var2.
                     super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>
                     .super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl,local_248,
                     local_268);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  if (iVar3 < 0) {
    std::__cxx11::string::assign((char *)&this->_errorMessage);
    iVar3 = -1;
  }
  else {
    memset(message,0,0x200);
    pCVar1 = (this->_commPort)._M_t.
             super___uniq_ptr_impl<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>._M_t.
             super__Tuple_impl<0UL,_Rainbow::CommPort_*,_std::default_delete<Rainbow::CommPort>_>.
             super__Head_base<0UL,_Rainbow::CommPort_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"220",&local_289);
    iVar3 = CommPort::Recv(pCVar1,message,0x1ff,0,&local_288,&this->_errorMessage);
    std::__cxx11::string::~string((string *)&local_288);
    iVar3 = iVar3 >> 0x1f;
  }
  return iVar3;
}

Assistant:

int flFTP::JoinServer(const std::string &host, const std::string &service)
	{
		_host = host;
		if(_commPort->Connect(host, service) < 0)
		{
			_errorMessage = "connection failed";
			return -1;
		}
		int ret;
		char message[BUFFER] = { 0 };

		ret = _commPort->Recv(message, BUFFER - 1, 0, FTP_SERVER_READY_OK, _errorMessage);
		if(ret < 0)
		{
			return -1;
		}

		return 0;
	}